

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O2

QList<QStaticPlugin> * QPluginLoader::staticPlugins(void)

{
  QArrayDataPointer<QStaticPlugin> *other;
  QArrayDataPointer<QStaticPlugin> *in_RDI;
  
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_staticPluginList>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    in_RDI->d = (Data *)0x0;
    in_RDI->ptr = (QStaticPlugin *)0x0;
    in_RDI->size = 0;
  }
  else {
    other = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_staticPluginList>_>::
             instance()->d;
    QArrayDataPointer<QStaticPlugin>::QArrayDataPointer(in_RDI,other);
  }
  return (QList<QStaticPlugin> *)in_RDI;
}

Assistant:

QList<QStaticPlugin> QPluginLoader::staticPlugins()
{
    StaticPluginList *plugins = staticPluginList();
    if (plugins)
        return *plugins;
    return QList<QStaticPlugin>();
}